

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationdatabuilder.cpp
# Opt level: O2

uint32_t __thiscall icu_63::CopyHelper::copyCE32(CopyHelper *this,uint32_t ce32)

{
  uint ce32_00;
  bool bVar1;
  uint uVar2;
  int iVar3;
  int32_t index;
  int32_t iVar4;
  uint32_t uVar5;
  undefined4 extraout_var;
  long lVar6;
  int64_t iVar7;
  undefined4 extraout_var_00;
  long lVar8;
  ConditionalCE32 *this_00;
  void *pvVar9;
  _func_int *UNRECOVERED_JUMPTABLE;
  int32_t j_1;
  ulong uVar10;
  int32_t i;
  ulong uVar11;
  int32_t i_1;
  CollationDataBuilder *pCVar12;
  int32_t j;
  ulong uVar13;
  int32_t *newCE32s;
  int64_t *ces;
  UnicodeString local_70;
  undefined4 extraout_var_01;
  
  if ((~ce32 & 0xc0) == 0) {
    uVar2 = ce32 & 0xf;
    if (uVar2 != 7) {
      if (uVar2 == 6) {
        ces = (int64_t *)((ulong)(ce32 >> 10 & 0x3ffff8) + (long)(this->src->ce64s).elements);
        uVar2 = ce32 >> 8 & 0x1f;
        uVar10 = (ulong)uVar2;
        bVar1 = false;
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          lVar6 = ces[uVar11];
          iVar3 = (*(this->modifier->super_UObject)._vptr_UObject[4])(this->modifier,lVar6);
          lVar8 = CONCAT44(extraout_var_01,iVar3);
          if (lVar8 == 0x101000100) {
            lVar8 = lVar6;
            if (bVar1) goto LAB_0022c59d;
            bVar1 = false;
          }
          else {
            if (!bVar1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                this->modifiedCEs[uVar13] = ces[uVar13];
              }
            }
LAB_0022c59d:
            this->modifiedCEs[uVar11] = lVar8;
            bVar1 = true;
          }
        }
        pCVar12 = this->dest;
        if (!bVar1) {
          uVar5 = CollationDataBuilder::encodeExpansion(pCVar12,ces,uVar2,&this->errorCode);
          return uVar5;
        }
        UNRECOVERED_JUMPTABLE = (pCVar12->super_UObject)._vptr_UObject[4];
      }
      else {
        if (uVar2 != 5) {
          return ce32;
        }
        newCE32s = (int32_t *)((ulong)(ce32 >> 0xb & 0x1ffffc) + (long)(this->src->ce32s).elements);
        uVar2 = ce32 >> 8 & 0x1f;
        uVar10 = (ulong)uVar2;
        bVar1 = false;
        for (uVar11 = 0; uVar11 != uVar10; uVar11 = uVar11 + 1) {
          ce32_00 = newCE32s[uVar11];
          if ((~ce32_00 & 0xc0) == 0) {
LAB_0022c4a4:
            if (bVar1) {
              lVar6 = Collation::ceFromCE32(ce32_00);
              goto LAB_0022c4cd;
            }
            bVar1 = false;
          }
          else {
            iVar3 = (*(this->modifier->super_UObject)._vptr_UObject[3])
                              (this->modifier,(ulong)ce32_00);
            lVar6 = CONCAT44(extraout_var,iVar3);
            if (lVar6 == 0x101000100) goto LAB_0022c4a4;
            if (!bVar1) {
              for (uVar13 = 0; uVar11 != uVar13; uVar13 = uVar13 + 1) {
                iVar7 = Collation::ceFromCE32(newCE32s[uVar13]);
                this->modifiedCEs[uVar13] = iVar7;
              }
            }
LAB_0022c4cd:
            this->modifiedCEs[uVar11] = lVar6;
            bVar1 = true;
          }
        }
        pCVar12 = this->dest;
        if (!bVar1) {
          uVar5 = CollationDataBuilder::encodeExpansion32(pCVar12,newCE32s,uVar2,&this->errorCode);
          return uVar5;
        }
        UNRECOVERED_JUMPTABLE = (pCVar12->super_UObject)._vptr_UObject[4];
      }
      uVar5 = (*UNRECOVERED_JUMPTABLE)(pCVar12,this->modifiedCEs,uVar10);
      return uVar5;
    }
    this_00 = CollationDataBuilder::getConditionalCE32ForCE32(this->src,ce32);
    pCVar12 = this->dest;
    uVar5 = copyCE32(this,this_00->ce32);
    index = CollationDataBuilder::addConditionalCE32
                      (pCVar12,&this_00->context,uVar5,&this->errorCode);
    ce32 = index << 0xd | 199;
    while (-1 < this_00->next) {
      this_00 = (ConditionalCE32 *)UVector::elementAt(&this->src->conditionalCE32s,this_00->next);
      pvVar9 = UVector::elementAt(&this->dest->conditionalCE32s,index);
      pCVar12 = this->dest;
      uVar5 = copyCE32(this,this_00->ce32);
      index = CollationDataBuilder::addConditionalCE32
                        (pCVar12,&this_00->context,uVar5,&this->errorCode);
      iVar4 = ConditionalCE32::prefixLength(this_00);
      pCVar12 = this->dest;
      UnicodeString::tempSubString(&local_70,&this_00->context,iVar4 + 1,0x7fffffff);
      UnicodeSet::addAll(&pCVar12->unsafeBackwardSet,&local_70);
      UnicodeString::~UnicodeString(&local_70);
      *(int32_t *)((long)pvVar9 + 0x54) = index;
    }
  }
  else {
    iVar3 = (*(this->modifier->super_UObject)._vptr_UObject[3])(this->modifier,ce32);
    if (CONCAT44(extraout_var_00,iVar3) != 0x101000100) {
      uVar5 = CollationDataBuilder::encodeOneCE
                        (this->dest,CONCAT44(extraout_var_00,iVar3),&this->errorCode);
      return uVar5;
    }
  }
  return ce32;
}

Assistant:

uint32_t copyCE32(uint32_t ce32) {
        if(!Collation::isSpecialCE32(ce32)) {
            int64_t ce = modifier.modifyCE32(ce32);
            if(ce != Collation::NO_CE) {
                ce32 = dest.encodeOneCE(ce, errorCode);
            }
        } else {
            int32_t tag = Collation::tagFromCE32(ce32);
            if(tag == Collation::EXPANSION32_TAG) {
                const uint32_t *srcCE32s = reinterpret_cast<uint32_t *>(src.ce32s.getBuffer());
                srcCE32s += Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                // Inspect the source CE32s. Just copy them if none are modified.
                // Otherwise copy to modifiedCEs, with modifications.
                UBool isModified = FALSE;
                for(int32_t i = 0; i < length; ++i) {
                    ce32 = srcCE32s[i];
                    int64_t ce;
                    if(Collation::isSpecialCE32(ce32) ||
                            (ce = modifier.modifyCE32(ce32)) == Collation::NO_CE) {
                        if(isModified) {
                            modifiedCEs[i] = Collation::ceFromCE32(ce32);
                        }
                    } else {
                        if(!isModified) {
                            for(int32_t j = 0; j < i; ++j) {
                                modifiedCEs[j] = Collation::ceFromCE32(srcCE32s[j]);
                            }
                            isModified = TRUE;
                        }
                        modifiedCEs[i] = ce;
                    }
                }
                if(isModified) {
                    ce32 = dest.encodeCEs(modifiedCEs, length, errorCode);
                } else {
                    ce32 = dest.encodeExpansion32(
                        reinterpret_cast<const int32_t *>(srcCE32s), length, errorCode);
                }
            } else if(tag == Collation::EXPANSION_TAG) {
                const int64_t *srcCEs = src.ce64s.getBuffer();
                srcCEs += Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                // Inspect the source CEs. Just copy them if none are modified.
                // Otherwise copy to modifiedCEs, with modifications.
                UBool isModified = FALSE;
                for(int32_t i = 0; i < length; ++i) {
                    int64_t srcCE = srcCEs[i];
                    int64_t ce = modifier.modifyCE(srcCE);
                    if(ce == Collation::NO_CE) {
                        if(isModified) {
                            modifiedCEs[i] = srcCE;
                        }
                    } else {
                        if(!isModified) {
                            for(int32_t j = 0; j < i; ++j) {
                                modifiedCEs[j] = srcCEs[j];
                            }
                            isModified = TRUE;
                        }
                        modifiedCEs[i] = ce;
                    }
                }
                if(isModified) {
                    ce32 = dest.encodeCEs(modifiedCEs, length, errorCode);
                } else {
                    ce32 = dest.encodeExpansion(srcCEs, length, errorCode);
                }
            } else if(tag == Collation::BUILDER_DATA_TAG) {
                // Copy the list of ConditionalCE32.
                ConditionalCE32 *cond = src.getConditionalCE32ForCE32(ce32);
                U_ASSERT(!cond->hasContext());
                int32_t destIndex = dest.addConditionalCE32(
                        cond->context, copyCE32(cond->ce32), errorCode);
                ce32 = CollationDataBuilder::makeBuilderContextCE32(destIndex);
                while(cond->next >= 0) {
                    cond = src.getConditionalCE32(cond->next);
                    ConditionalCE32 *prevDestCond = dest.getConditionalCE32(destIndex);
                    destIndex = dest.addConditionalCE32(
                            cond->context, copyCE32(cond->ce32), errorCode);
                    int32_t suffixStart = cond->prefixLength() + 1;
                    dest.unsafeBackwardSet.addAll(cond->context.tempSubString(suffixStart));
                    prevDestCond->next = destIndex;
                }
            } else {
                // Just copy long CEs and Latin mini expansions (and other expected values) as is,
                // assuming that the modifier would not modify them.
                U_ASSERT(tag == Collation::LONG_PRIMARY_TAG ||
                        tag == Collation::LONG_SECONDARY_TAG ||
                        tag == Collation::LATIN_EXPANSION_TAG ||
                        tag == Collation::HANGUL_TAG);
            }
        }
        return ce32;
    }